

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qinputdialog.cpp
# Opt level: O3

void QInputDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 local_20;
  void *local_18;
  undefined8 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == textValueChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == textValueSelected && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == intValueChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == intValueSelected && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == doubleValueChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar1 == doubleValueSelected && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      local_10 = (undefined8 *)_a[1];
      iVar3 = 0;
      break;
    case 1:
      local_10 = (undefined8 *)_a[1];
      iVar3 = 1;
      break;
    case 2:
      local_10 = &local_20;
      local_20 = CONCAT44(local_20._4_4_,*_a[1]);
      iVar3 = 2;
      break;
    case 3:
      local_10 = &local_20;
      local_20 = CONCAT44(local_20._4_4_,*_a[1]);
      iVar3 = 3;
      break;
    case 4:
      local_20 = *_a[1];
      local_10 = &local_20;
      iVar3 = 4;
      break;
    case 5:
      local_20 = *_a[1];
      local_10 = &local_20;
      iVar3 = 5;
      break;
    default:
      goto switchD_0050031a_default;
    }
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_18);
  }
switchD_0050031a_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QInputDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QInputDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textValueChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->textValueSelected((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->intValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->intValueSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->doubleValueChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 5: _t->doubleValueSelected((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(const QString & )>(_a, &QInputDialog::textValueChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(const QString & )>(_a, &QInputDialog::textValueSelected, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(int )>(_a, &QInputDialog::intValueChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(int )>(_a, &QInputDialog::intValueSelected, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(double )>(_a, &QInputDialog::doubleValueChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QInputDialog::*)(double )>(_a, &QInputDialog::doubleValueSelected, 5))
            return;
    }
}